

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void burn_object(void *arg,long timeout)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  boolean bVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  xchar y;
  xchar x;
  char whose [256];
  
  sVar2 = *(short *)((long)arg + 0x2a);
  if (sVar2 == 0x10b) {
    bVar13 = SBORROW1(*(char *)((long)arg + 0x34),'\x02');
    bVar12 = (char)(*(char *)((long)arg + 0x34) + -2) < '\0';
  }
  else {
    bVar13 = SBORROW4(*(int *)((long)arg + 0x30),2);
    bVar12 = *(int *)((long)arg + 0x30) + -2 < 0;
  }
  bVar12 = bVar13 == bVar12;
  lVar6 = (ulong)moves - timeout;
  if (lVar6 != 0) {
    if (lVar6 < *(int *)((long)arg + 0x5c)) {
      *(int *)((long)arg + 0x5c) = *(int *)((long)arg + 0x5c) - (int)lVar6;
      begin_burn(level,(obj *)arg,'\x01');
      return;
    }
    *(undefined4 *)((long)arg + 0x5c) = 0;
    end_burn((obj *)arg,'\0');
    if (sVar2 == 0x10b) {
      *(undefined1 *)((long)arg + 0x34) = 0;
      iVar5 = weight((obj *)arg);
      *(int *)((long)arg + 0x2c) = iVar5;
      if (*(char *)((long)arg + 0x48) != '\x03') {
        return;
      }
      encumber_msg();
      return;
    }
    if ((1 < *(ushort *)((long)arg + 0x2a) - 0xe5) && (*(ushort *)((long)arg + 0x2a) != 0x142)) {
      return;
    }
    obj_extract_self((obj *)arg);
    obfree((obj *)arg,(obj *)0x0);
    return;
  }
  bVar4 = get_obj_location((obj *)arg,&x,&y,0);
  if (bVar4 == '\0') {
    bVar13 = true;
  }
  else {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024c885;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024c87c;
LAB_0024c974:
      bVar13 = (viz_array[y][x] & 2U) == 0;
    }
    else {
LAB_0024c87c:
      if (ublindf == (obj *)0x0) {
        bVar13 = true;
      }
      else {
LAB_0024c885:
        bVar13 = true;
        if (ublindf->oartifact == '\x1d') goto LAB_0024c974;
      }
    }
    Shk_Your(whose,(obj *)arg);
  }
  uVar3 = *(ushort *)((long)arg + 0x2a);
  uVar8 = uVar3 - 0xe5;
  if (0x26 < uVar8) {
LAB_0024cac3:
    if (uVar3 != 0x142) {
      pcVar10 = xname((obj *)arg);
      warning("burn_object: unexpeced obj %s",pcVar10);
      return;
    }
    if (bVar13) {
LAB_0024cad4:
      bVar13 = false;
    }
    else if (*(byte *)((long)arg + 0x48) - 3 < 2) {
      bVar13 = false;
      pline("%s potion of oil has burnt away.");
    }
    else {
      if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0024cad4;
      pline("You see a burning potion of oil go out.");
      bVar13 = true;
    }
    end_burn((obj *)arg,'\0');
LAB_0024cfe9:
    obj_extract_self((obj *)arg);
    obfree((obj *)arg,(obj *)0x0);
LAB_0024cffb:
    if (bVar13) {
      newsym((int)x,(int)y);
    }
    return;
  }
  if ((0x4000000003U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
    iVar5 = *(int *)((long)arg + 0x5c);
    if (iVar5 == 0) {
      if ((bVar13) && (*(char *)((long)arg + 0x48) != '\x03')) {
LAB_0024cdc2:
        bVar13 = false;
      }
      else {
        bVar1 = *(byte *)((long)arg + 0x48);
        if (sVar2 == 0x10b) {
          if (bVar1 - 3 < 2) {
            pcVar10 = " dies";
            if (bVar12) {
              pcVar10 = "s die";
            }
            pline("%s candelabrum\'s flame%s.",whose,pcVar10);
          }
          else {
            if (bVar1 != 1) goto LAB_0024cdc2;
            pline("You see a candelabrum\'s flame%s die.");
          }
          bVar13 = false;
          *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
        }
        else {
          if (bVar1 - 3 < 2) {
            pcVar10 = xname((obj *)arg);
            pcVar9 = "is";
            if (bVar12) {
              pcVar9 = "are";
            }
            bVar13 = false;
            pline("%s %s %s consumed!",whose,pcVar10,pcVar9);
LAB_0024ce11:
            *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
          }
          else {
            if (bVar1 == 1) {
              pcVar10 = "";
              pcVar9 = xname((obj *)arg);
              if (bVar12) {
                pcVar10 = "some ";
              }
              else {
                pcVar9 = an(pcVar9);
              }
              pline("You see %s%s consumed!",pcVar10,pcVar9);
              bVar13 = true;
              goto LAB_0024ce11;
            }
            bVar13 = false;
          }
          if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
             ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024cf48;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024cf43;
LAB_0024cf85:
              pcVar9 = "Their flames die.";
              pcVar10 = "Its flame dies.";
              goto LAB_0024cf93;
            }
LAB_0024cf43:
            if (ublindf != (obj *)0x0) {
LAB_0024cf48:
              if (ublindf->oartifact == '\x1d') goto LAB_0024cf85;
            }
            pcVar10 = "";
          }
          else {
            pcVar9 = "They shriek!";
            pcVar10 = "It shrieks!";
LAB_0024cf93:
            if (bVar12) {
              pcVar10 = pcVar9;
            }
          }
          pline(pcVar10);
        }
      }
      end_burn((obj *)arg,'\0');
      if (sVar2 != 0x10b) goto LAB_0024cfe9;
      *(undefined1 *)((long)arg + 0x34) = 0;
      iVar5 = weight((obj *)arg);
      *(int *)((long)arg + 0x2c) = iVar5;
      if (*(char *)((long)arg + 0x48) == '\x03') {
        encumber_msg();
      }
LAB_0024cfcc:
      if (*(int *)((long)arg + 0x5c) == 0) goto LAB_0024cffb;
    }
    else {
      if (iVar5 == 0xf) {
        if (!bVar13) {
          if (*(byte *)((long)arg + 0x48) - 3 < 2) {
            pcVar10 = "a candelabrum\'s ";
            if (sVar2 != 0x10b) {
              pcVar10 = "\n\n";
            }
            pcVar9 = "\'s";
            if (bVar12) {
              pcVar9 = "s\'";
            }
            pcVar11 = "s";
            pcVar7 = "";
            if (bVar12) {
              pcVar7 = "s";
              pcVar11 = "";
            }
            pline("%s %scandle%s flame%s flicker%s low!",whose,pcVar10 + 2,pcVar9,pcVar7,pcVar11);
            goto LAB_0024cd57;
          }
          if (*(byte *)((long)arg + 0x48) == 1) {
            pcVar10 = "a ";
            if (bVar12) {
              pcVar10 = "some ";
            }
            pcVar9 = "\'s";
            if (bVar12) {
              pcVar9 = "s\'";
            }
            pcVar7 = "";
            if (bVar12) {
              pcVar7 = "s";
            }
            pcVar11 = "a candelabrum\'s ";
            if (sVar2 != 0x10b) {
              pcVar11 = pcVar10;
            }
            pcVar10 = "You see %scandle%s flame%s flicker low!";
            goto LAB_0024ccfd;
          }
        }
      }
      else if ((iVar5 == 0x4b) && (!bVar13)) {
        if (*(byte *)((long)arg + 0x48) - 3 < 2) {
          pcVar9 = "\n\n";
          if (sVar2 == 0x10b) {
            pcVar9 = "a candelabrum\'s ";
          }
          pcVar9 = pcVar9 + 2;
          pcVar7 = " is";
          if (bVar12) {
            pcVar7 = "s are";
          }
          pcVar10 = "%s %scandle%s getting short.";
          pcVar11 = whose;
LAB_0024ccfd:
          pline(pcVar10,pcVar11,pcVar9,pcVar7);
        }
        else {
          if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0024cb03;
          pcVar10 = "a ";
          if (bVar12) {
            pcVar10 = "some ";
          }
          pcVar9 = "";
          if (bVar12) {
            pcVar9 = "s";
          }
          pcVar7 = "a candelabrum\'s ";
          if (sVar2 != 0x10b) {
            pcVar7 = pcVar10;
          }
          pline("You see %scandle%s getting short.",pcVar7,pcVar9);
        }
LAB_0024cd57:
        bVar13 = false;
        *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
        goto LAB_0024cfcc;
      }
LAB_0024cb03:
      bVar13 = false;
    }
    begin_burn(level,(obj *)arg,'\x01');
    goto LAB_0024cffb;
  }
  if ((0xcUL >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_0024cac3;
  iVar5 = *(int *)((long)arg + 0x5c);
  if (iVar5 == 0) {
    bVar1 = *(byte *)((long)arg + 0x48);
    if (bVar13) {
      if (bVar1 == 3) {
LAB_0024cd6c:
        if (uVar3 == 0xe7) {
          pcVar10 = "%s lantern has run out of power.";
LAB_0024cd82:
          pline(pcVar10);
        }
        else {
          pcVar10 = xname((obj *)arg);
          pline("%s %s has gone out.",whose,pcVar10);
        }
        goto LAB_0024ceb3;
      }
    }
    else {
      if (bVar1 - 3 < 2) goto LAB_0024cd6c;
      if (bVar1 != 1) goto LAB_0024ceb7;
      if (uVar3 != 0xe7) {
        pcVar10 = xname((obj *)arg);
        an(pcVar10);
        pcVar10 = "You see %s go out.";
        goto LAB_0024cd82;
      }
      pline("You see a lantern run out of power.");
LAB_0024ceb3:
      *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
    }
LAB_0024ceb7:
    end_burn((obj *)arg,'\0');
  }
  else if (iVar5 == 0x19) {
    if (bVar13) goto LAB_0024cecb;
    if (uVar3 == 0xe7) {
LAB_0024cc0c:
      lantern_message((obj *)arg);
      goto LAB_0024cec1;
    }
    if (*(byte *)((long)arg + 0x48) - 3 < 2) {
      pcVar9 = xname((obj *)arg);
      pcVar7 = "%s %s seems about to go out.";
      pcVar10 = whose;
      goto LAB_0024ce40;
    }
    if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0024cec1;
    pcVar10 = xname((obj *)arg);
    pcVar10 = an(pcVar10);
    pline("You see %s about to go out.",pcVar10);
LAB_0024ce47:
    *(byte *)((long)arg + 0x4a) = *(byte *)((long)arg + 0x4a) | 0x10;
  }
  else {
    if (((iVar5 != 0x32) && (iVar5 != 0x96)) && (iVar5 != 100)) goto LAB_0024cecb;
    if (!bVar13) {
      if (uVar3 == 0xe7) goto LAB_0024cc0c;
      pcVar9 = "";
      if (iVar5 == 0x32) {
        pcVar9 = " considerably";
      }
      if (*(byte *)((long)arg + 0x48) - 3 < 2) {
        pcVar10 = Yname2((obj *)arg);
        pcVar7 = "%s flickers%s.";
      }
      else {
        if (*(byte *)((long)arg + 0x48) != 1) goto LAB_0024cec1;
        pcVar10 = xname((obj *)arg);
        pcVar10 = an(pcVar10);
        pcVar7 = "You see %s flicker%s.";
      }
LAB_0024ce40:
      pline(pcVar7,pcVar10,pcVar9);
      goto LAB_0024ce47;
    }
  }
LAB_0024cec1:
  if (*(int *)((long)arg + 0x5c) == 0) {
    return;
  }
LAB_0024cecb:
  begin_burn(level,(obj *)arg,'\x01');
  return;
}

Assistant:

void burn_object(void *arg, long timeout)
{
	struct obj *obj = (struct obj *) arg;
	boolean canseeit, many, menorah, need_newsym;
	xchar x, y;
	char whose[BUFSZ];

	menorah = obj->otyp == CANDELABRUM_OF_INVOCATION;
	many = menorah ? obj->spe > 1 : obj->quan > 1L;

	/* timeout while away */
	if (timeout != moves) {
	    long how_long = moves - timeout;

	    if (how_long >= obj->age) {
		obj->age = 0;
		end_burn(obj, FALSE);

		if (menorah) {
		    obj->spe = 0;	/* no more candles */
		    obj->owt = weight(obj);
		    if (carried(obj)) encumber_msg();
		} else if (Is_candle(obj) || obj->otyp == POT_OIL) {
		    /* get rid of candles and burning oil potions */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		}

	    } else {
		obj->age -= how_long;
		begin_burn(level, obj, TRUE);
	    }
	    return;
	}

	/* only interested in INVENT, FLOOR, and MINVENT */
	if (get_obj_location(obj, &x, &y, 0)) {
	    canseeit = !Blind && cansee(x, y);
	    /* set up `whose[]' to be "Your" or "Fred's" or "The goblin's" */
	    Shk_Your(whose, obj);
	} else {
	    canseeit = FALSE;
	}
	need_newsym = FALSE;

	/* obj->age is the age remaining at this point.  */
	switch (obj->otyp) {
	    case POT_OIL:
		    /* this should only be called when we run out */
		    if (canseeit) {
			switch (obj->where) {
			    case OBJ_INVENT:
			    case OBJ_MINVENT:
				pline("%s potion of oil has burnt away.",
				    whose);
				break;
			    case OBJ_FLOOR:
				pline("You see a burning potion of oil go out.");
				need_newsym = TRUE;
				break;
			}
		    }
		    end_burn(obj, FALSE);	/* turn off light source */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		    break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		switch((int)obj->age) {
		    case 150:
		    case 100:
		    case 50:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else
				see_lamp_flicker(obj,
				    obj->age == 50L ? " considerably" : "");
			}
			break;

		    case 25:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s seems about to go out.",
					    whose, xname(obj));
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see %s about to go out.",
					    an(xname(obj)));
					obj->known = 1;
					break;
				}
			    }
			}
			break;

		    case 0:
			/* even if blind you'll know if holding it */
			if (canseeit || obj->where == OBJ_INVENT) {
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    if (obj->otyp == BRASS_LANTERN)
					pline("%s lantern has run out of power.",
					    whose);
				    else
					pline("%s %s has gone out.",
					    whose, xname(obj));
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    if (obj->otyp == BRASS_LANTERN)
					pline("You see a lantern run out of power.");
				    else
					pline("You see %s go out.",
					    an(xname(obj)));
				    obj->known = 1;
				    break;
			    }
			}
			end_burn(obj, FALSE);
			break;

		    default:
			/*
			 * Someone added fuel to the lamp while it was
			 * lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		switch (obj->age) {
		    case 75:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline("%s %scandle%s getting short.",
					whose,
					menorah ? "candelabrum's " : "",
					many ? "s are" : " is");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s getting short.",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 15:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline(
					"%s %scandle%s flame%s flicker%s low!",
					    whose,
					    menorah ? "candelabrum's " : "",
					    many ? "s'" : "'s",
					    many ? "s" : "",
					    many ? "" : "s");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s flame%s flicker low!",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s'" : "'s",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 0:
			/* we know even if blind and in our inventory */
			if (canseeit || obj->where == OBJ_INVENT) {
			    if (menorah) {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s candelabrum's flame%s.",
					    whose,
					    many ? "s die" : " dies");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see a candelabrum's flame%s die.",
						many ? "s" : "");
					obj->known = 1;
					break;
				}
			    } else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s %s consumed!",
					    whose,
					    xname(obj),
					    many ? "are" : "is");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					/*
					You see some wax candles consumed!
					You see a wax candle consumed!
					*/
					pline("You see %s%s consumed!",
					    many ? "some " : "",
					    many ? xname(obj):an(xname(obj)));
					need_newsym = TRUE;
					obj->known = 1;
					break;
				}

				/* post message */
				pline(Hallucination ?
					(many ? "They shriek!" :
						"It shrieks!") :
					Blind ? "" :
					    (many ? "Their flames die." :
						    "Its flame dies."));
			    }
			}
			end_burn(obj, FALSE);

			if (menorah) {
			    obj->spe = 0;
			    obj->owt = weight(obj); /* no more candles */
			    if (carried(obj)) encumber_msg();
			} else {
			    obj_extract_self(obj);
			    obfree(obj, NULL);
			    obj = NULL;
			}
			break;

		    default:
			/*
			 * Someone added fuel (candles) to the menorah while
			 * it was lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    default:
		warning("burn_object: unexpeced obj %s", xname(obj));
		break;
	}
	if (need_newsym) newsym(x, y);
}